

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::scan
               (Untee *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_> *pPVar6;
  _func_void_Untee_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00b8492d:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_00b84548:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00b8492d;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>::
      emplace_back<void(*&)(wasm::Untee*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>
                     ).super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                     super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00b8448e;
  case LoopId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83dfc;
  case BreakId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00b8492d;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>::
      emplace_back<void(*&)(wasm::Untee*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>
                     ).super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                     super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00b83c44;
  case SwitchId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x00b83c3e;
  case CallId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00b8492d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00b8492d;
    }
    break;
  case LocalSetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84133;
  case GlobalGetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00b8492d;
    }
    break;
  case GlobalSetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83dfc;
  case LoadId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00b8492d;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00b84387;
  case StoreId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00b8492d;
    }
    goto LAB_00b840f8;
  case ConstId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00b8492d;
    }
    break;
  case UnaryId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84133;
  case BinaryId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84087;
  case SelectId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84363;
  case DropId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case ReturnId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83c35;
  case MemorySizeId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00b8492d;
    }
    break;
  case MemoryGrowId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case NopId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00b8492d;
    }
    break;
  case UnreachableId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00b8492d;
    }
    break;
  case AtomicRMWId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8417c;
  case AtomicCmpxchgId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8416d;
  case AtomicWaitId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83e21;
  case AtomicNotifyId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84087;
  case AtomicFenceId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00b8492d;
    }
    break;
  case SIMDExtractId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84133;
  case SIMDReplaceId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00b8492d;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00b84092;
  case SIMDShuffleId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84372;
  case SIMDTernaryId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83e21;
  case SIMDShiftId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84087;
  case SIMDLoadId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84000;
  case SIMDLoadStoreLaneId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00b8492d;
    }
LAB_00b840f8:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00b84387;
  case MemoryInitId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8416d;
  case DataDropId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00b8492d;
    }
    break;
  case MemoryCopyId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84363;
  case MemoryFillId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84363;
  case PopId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00b8492d;
    }
    break;
  case RefNullId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00b8492d;
    }
    break;
  case RefIsNullId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case RefFuncId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00b8492d;
    }
    break;
  case RefEqId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84372;
  case TableGetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83dfc;
  case TableSetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8417c;
  case TableSizeId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00b8492d;
    }
    break;
  case TableGrowId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8417c;
  case TableFillId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8416d;
  case TableCopyId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84363;
  case TableInitId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8416d;
  case TryId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00b8492d;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_00b83dfc:
    pEVar1 = pEVar1 + 2;
    goto LAB_00b84387;
  case TryTableId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case ThrowId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00b8492d;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00b8492d;
    }
    break;
  case ThrowRefId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case TupleMakeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00b8492d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case RefI31Id:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case I31GetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case CallRefId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case RefCastId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case BrOnId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00b8492d;
    }
LAB_00b84000:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00b84387;
  case StructNewId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00b8492d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84133;
  case StructSetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84087;
  case StructRMWId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84087;
  case StructCmpxchgId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStructCmpxchg,currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_00b8492d;
    }
LAB_00b83e21:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00b84092;
  case ArrayNewId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
LAB_00b83c35:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x00b83c3e:
    if (lVar5 != 0) {
LAB_00b83c44:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>::
      emplace_back<void(*&)(wasm::Untee*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>
                     ).super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                     super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8417c;
  case ArrayNewElemId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_00b8492d;
    }
    goto LAB_00b8417c;
  case ArrayNewFixedId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00b8492d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84372;
  case ArraySetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84363;
  case ArrayLenId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00b8492d;
    }
    goto LAB_00b83ec8;
  case ArrayCopyId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00b84354;
  case ArrayFillId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00b8492d;
    }
LAB_00b84354:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00b84363;
  case ArrayInitDataId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayInitData,currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_00b8492d;
    }
    goto LAB_00b836bf;
  case ArrayInitElemId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitArrayInitElem,currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_00b8492d;
    }
LAB_00b836bf:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_00b8416d:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
LAB_00b8417c:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00b84387;
  case RefAsId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84133;
  case StringNewId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00b8492d;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>::
      emplace_back<void(*&)(wasm::Untee*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>
                     ).super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                     super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>::
      emplace_back<void(*&)(wasm::Untee*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>
                     ).super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                     super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00b8448e;
  case StringConstId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00b8492d;
    }
    break;
  case StringMeasureId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00b8492d;
    }
LAB_00b84133:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00b84387;
  case StringEncodeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00b8492d;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>::
      emplace_back<void(*&)(wasm::Untee*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::Untee,wasm::Visitor<wasm::Untee,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>
                     ).super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                     super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_00b8448e:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84372;
  case StringEqId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00b8492d;
    }
LAB_00b84087:
    currp_00 = pEVar1 + 2;
LAB_00b84092:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00b84387;
  case StringWTF16GetId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00b8492d;
    }
    goto LAB_00b84372;
  case StringSliceWTFId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00b8492d;
    }
LAB_00b84363:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
LAB_00b84372:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00b84387;
  case ContNewId:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_00b8492d;
    }
LAB_00b83ec8:
    pEVar1 = pEVar1 + 1;
LAB_00b84387:
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>)
                .super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>.
                super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)pEVar1);
    return;
  case ContBindId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case SuspendId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_00b8492d;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[5].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 5) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeThrowId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[6].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 6) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StackSwitchId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
              super_PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>;
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,
               Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_00b8492d;
    }
    Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
              (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
               (Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00b84548;
        Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>::pushTask
                  (&pPVar6->super_Walker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }